

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O1

void packBE(uint8_t *p,uint32_t value,uint8_t u8Size)

{
  uint8_t *puVar1;
  
  if (0xfb < (byte)(u8Size - 5)) {
    puVar1 = p + (u8Size - 1);
    do {
      *puVar1 = (uint8_t)value;
      puVar1 = puVar1 + -1;
      value = value >> 8;
      u8Size = u8Size + 0xff;
    } while (u8Size != '\0');
  }
  return;
}

Assistant:

void packBE(_PACK_UINT8* p, _PACK_UINT32 value, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_BIG_ENDIAN)
      memcpy(p, &value, u8Size);
#else
      register _PACK_UINT32 tmp = value;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         *(p--) = (_PACK_UINT8)tmp;
         tmp = tmp >> 8;
         u8Size--;
      }
#endif
   }
}